

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_split
          (HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  PrimRef *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  long lVar8;
  PrimRef *ref;
  PrimRef *ref_00;
  unsigned_long uVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  anon_class_1_0_00000001 local_131;
  long local_130;
  unsigned_long local_128;
  PrimInfoExtRange *local_120;
  unsigned_long local_118;
  PrimInfoExtRange *local_110;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  unsigned_long uStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  unsigned_long uStack_70;
  vbool4 vSplitMask;
  vint4 vSplitPos;
  anon_class_24_3_36a9e8c5 local_48;
  
  local_128 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  local_118 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_108._0_8_ = 0x7f8000007f800000;
  local_108._8_8_ = 0x7f8000007f800000;
  local_f8 = 0xff800000ff800000;
  uStack_f0 = 0xff800000ff800000;
  local_e8 = 0x7f8000007f800000;
  uStack_e0 = 0x7f8000007f800000;
  local_d8 = 0xff800000ff800000;
  uStack_d0 = 0xff800000ff800000;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8._0_8_ = 0x7f8000007f800000;
  local_b8._8_8_ = 0x7f8000007f800000;
  local_a8 = 0xff800000ff800000;
  uStack_a0 = 0xff800000ff800000;
  local_98 = 0x7f8000007f800000;
  uStack_90 = 0x7f8000007f800000;
  local_88 = 0xff800000ff800000;
  uStack_80 = 0xff800000ff800000;
  local_78 = 0;
  uStack_70 = 0;
  vSplitPos.field_0.i[0] = split->pos;
  local_48.mapping = &split->mapping;
  local_48.vSplitPos = &vSplitPos;
  lVar8 = (long)(1 << ((byte)split->dim & 0x1f)) * 0x10;
  vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar8);
  vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar8 + 8);
  local_48.vSplitMask = &vSplitMask;
  pPVar1 = this->prims0;
  ref_00 = pPVar1 + local_128;
  ref = pPVar1 + local_118;
  local_130 = -(long)pPVar1;
  local_120 = lset;
  local_110 = rset;
  vSplitPos.field_0.i[1] = vSplitPos.field_0.i[0];
  vSplitPos.field_0.i[2] = vSplitPos.field_0.i[0];
  vSplitPos.field_0.i[3] = vSplitPos.field_0.i[0];
  do {
    ref = ref + -1;
    lVar8 = (long)&(ref_00->lower).field_0 + local_130;
    for (; ref_00 <= ref; ref_00 = ref_00 + 1) {
      bVar7 = sequential_spatial_split::anon_class_24_3_36a9e8c5::operator()(&local_48,ref_00);
      if (!bVar7) break;
      sequential_spatial_split::anon_class_1_0_00000001::operator()
                (&local_131,(PrimInfo *)&local_108.field_1,ref_00);
      lVar8 = lVar8 + 0x20;
    }
    while( true ) {
      if (ref < ref_00) {
        uVar9 = lVar8 >> 5;
        *(undefined8 *)&(local_120->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
             local_108._0_8_;
        *(undefined8 *)((long)&(local_120->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_108._8_8_;
        *(undefined8 *)&(local_120->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_f8;
        *(undefined8 *)((long)&(local_120->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             uStack_f0;
        *(undefined8 *)&(local_120->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_e8;
        *(undefined8 *)((long)&(local_120->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             uStack_e0;
        *(undefined8 *)&(local_120->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_d8;
        *(undefined8 *)((long)&(local_120->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             uStack_d0;
        (local_120->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin =
             local_128;
        (local_120->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar9;
        (local_120->super_extended_range<unsigned_long>)._ext_end = uVar9;
        *(undefined8 *)&(local_110->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_b8._0_8_
        ;
        *(undefined8 *)((long)&(local_110->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_b8._8_8_;
        *(undefined8 *)&(local_110->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_a8;
        *(undefined8 *)((long)&(local_110->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             uStack_a0;
        *(undefined8 *)&(local_110->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_98;
        *(undefined8 *)((long)&(local_110->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             uStack_90;
        *(undefined8 *)&(local_110->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_88;
        *(undefined8 *)((long)&(local_110->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             uStack_80;
        (local_110->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar9;
        (local_110->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = local_118
        ;
        (local_110->super_extended_range<unsigned_long>)._ext_end = local_118;
        pVar10.second = uStack_70;
        pVar10.first = uStack_c0;
        return pVar10;
      }
      bVar7 = sequential_spatial_split::anon_class_24_3_36a9e8c5::operator()(&local_48,ref);
      if (bVar7) break;
      sequential_spatial_split::anon_class_1_0_00000001::operator()
                (&local_131,(PrimInfo *)&local_b8.field_1,ref);
      ref = ref + -1;
    }
    sequential_spatial_split::anon_class_1_0_00000001::operator()
              (&local_131,(PrimInfo *)&local_108.field_1,ref);
    sequential_spatial_split::anon_class_1_0_00000001::operator()
              (&local_131,(PrimInfo *)&local_b8.field_1,ref_00);
    uVar2 = *(undefined8 *)&(ref_00->lower).field_0;
    uVar3 = *(undefined8 *)((long)&(ref_00->lower).field_0 + 8);
    uVar4 = *(undefined8 *)&(ref_00->upper).field_0;
    uVar5 = *(undefined8 *)((long)&(ref_00->upper).field_0 + 8);
    uVar6 = *(undefined8 *)((long)&(ref->lower).field_0 + 8);
    *(undefined8 *)&(ref_00->lower).field_0 = *(undefined8 *)&(ref->lower).field_0;
    *(undefined8 *)((long)&(ref_00->lower).field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(ref->upper).field_0 + 8);
    *(undefined8 *)&(ref_00->upper).field_0 = *(undefined8 *)&(ref->upper).field_0;
    *(undefined8 *)((long)&(ref_00->upper).field_0 + 8) = uVar6;
    *(undefined8 *)&(ref->lower).field_0 = uVar2;
    *(undefined8 *)((long)&(ref->lower).field_0 + 8) = uVar3;
    *(undefined8 *)&(ref->upper).field_0 = uVar4;
    *(undefined8 *)((long)&(ref->upper).field_0 + 8) = uVar5;
    ref_00 = ref_00 + 1;
  } while( true );
}

Assistant:

__noinline std::pair<size_t,size_t> sequential_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS> &mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) {
                                                const Vec3fa c = ref.bounds().center();
                                                return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });

          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);
          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }